

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ct_constant.hpp
# Opt level: O1

string * __thiscall
viennamath::ct_constant<1l>::str_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  std::__ostream_insert<char,std::char_traits<char>>(local_188,"ct_constant<",0xc);
  poVar1 = std::ostream::_M_insert<long>((long)local_188);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,">",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
      {
        std::stringstream ss;
        ss << "ct_constant<" << value_ << ">";
        return ss.str();
      }